

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.cpp
# Opt level: O1

bool __thiscall
HighsImplications::runProbing(HighsImplications *this,HighsInt col,HighsInt *numReductions)

{
  double *pdVar1;
  pointer *ppHVar2;
  double dVar3;
  uint uVar4;
  HighsMipSolverData *pHVar5;
  pointer pIVar6;
  HighsMipSolverData *pHVar7;
  iterator __position;
  pointer pHVar8;
  bool bVar9;
  long lVar10;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *pvVar11;
  HighsInt loc;
  pointer pHVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  HighsDomainChange boundchg;
  HighsDomainChange boundchg_00;
  bool infeasible;
  HighsInt implcol;
  HighsSubstitution substitution;
  bool local_a9;
  ulong local_a8;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_a0;
  long local_98;
  pointer local_90;
  ulong local_88;
  ulong local_80;
  HighsDomain *local_78;
  HighsSubstitution local_70;
  double local_58;
  double local_50;
  vector<HighsSubstitution,std::allocator<HighsSubstitution>> *local_48;
  ulong local_40;
  ulong local_38;
  
  pHVar5 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  lVar15 = (long)col;
  if (((((*(char *)(*(long *)&(((pHVar5->domain).mipsolver)->model_->integrality_).
                              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                              _M_impl + lVar15) == '\0') ||
        (dVar3 = *(double *)
                  (*(long *)&(pHVar5->domain).col_lower_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar15 * 8), dVar3 != 0.0)) || (NAN(dVar3))) ||
      (((dVar3 = *(double *)
                  (*(long *)&(pHVar5->domain).col_upper_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar15 * 8), dVar3 != 1.0 || (NAN(dVar3))) ||
       ((pIVar6 = (this->implications).
                  super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
                  ._M_impl.super__Vector_impl_data._M_start, pIVar6[col * 2 + 1].computed != false
        || (iVar18 = col * 2, pIVar6[iVar18].computed != false)))))) ||
     ((lVar10 = (long)*(int *)(*(long *)&(pHVar5->cliquetable).colsubstituted.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl +
                              lVar15 * 4), lVar10 != 0 &&
      (*(long *)&(pHVar5->cliquetable).substitutions.
                 super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                 ._M_impl + lVar10 * 8 != 8)))) {
    bVar9 = false;
  }
  else {
    local_a9 = computeImplications(this,col,true);
    if ((!local_a9) && ((pHVar5->domain).infeasible_ == false)) {
      pHVar7 = (this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      lVar10 = (long)*(int *)(*(long *)&(pHVar7->cliquetable).colsubstituted.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl +
                             lVar15 * 4);
      if (((lVar10 == 0) ||
          (*(long *)&(pHVar7->cliquetable).substitutions.
                     super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                     ._M_impl + lVar10 * 8 == 8)) &&
         ((local_a9 = computeImplications(this,col,false), !local_a9 &&
          ((pHVar5->domain).infeasible_ == false)))) {
        pHVar7 = (this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        lVar15 = (long)*(int *)(*(long *)&(pHVar7->cliquetable).colsubstituted.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl +
                               lVar15 * 4);
        if ((lVar15 == 0) ||
           (*(long *)&(pHVar7->cliquetable).substitutions.
                      super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                      ._M_impl + lVar15 * 8 == 8)) {
          if ((this->implications).
              super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar18].computed == false) {
            local_a9 = computeImplications(this,col,false);
          }
          else {
            local_a9 = false;
          }
          local_90 = (this->implications).
                     super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pvVar11 = getImplications(this,col,true,&local_a9);
          local_80 = (ulong)((long)(pvVar11->
                                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar11->
                                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4;
          if ((0 < (int)local_80) &&
             (local_88 = (ulong)((long)*(pointer *)
                                        ((long)&local_90[iVar18].implics.
                                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                                ._M_impl + 8) -
                                *(long *)&local_90[iVar18].implics.
                                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                          ._M_impl) >> 4, 0 < (int)local_88)) {
            local_78 = &pHVar5->domain;
            local_90 = local_90 + iVar18;
            local_48 = (vector<HighsSubstitution,std::allocator<HighsSubstitution>> *)
                       &this->substitutions;
            local_38 = local_88 & 0x7fffffff;
            local_40 = local_80 & 0x7fffffff;
            iVar18 = 0;
            iVar13 = 0;
            local_a0 = pvVar11;
            do {
              lVar17 = (long)iVar18;
              pHVar12 = (pvVar11->
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              uVar4 = pHVar12[lVar17].column;
              local_a8 = (ulong)uVar4;
              lVar10 = (long)iVar13;
              lVar15 = *(long *)&(local_90->implics).
                                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                 ._M_impl;
              iVar19 = *(int *)(lVar15 + 8 + lVar10 * 0x10);
              if ((int)uVar4 < iVar19) {
                iVar18 = iVar18 + 1;
              }
              else if (iVar19 < (int)uVar4) {
                iVar13 = iVar13 + 1;
              }
              else {
                local_98 = (long)(int)uVar4;
                dVar3 = *(double *)
                         (*(long *)&(pHVar5->domain).col_lower_.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         local_98 * 8);
                dVar23 = *(double *)
                          (*(long *)&(pHVar5->domain).col_upper_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          local_98 * 8);
                iVar19 = iVar13 + 1;
                if (iVar13 + 1 <= (int)local_88) {
                  iVar19 = (int)local_88;
                }
                pdVar16 = (double *)(lVar15 + lVar10 * 0x10);
                dVar20 = dVar3;
                dVar25 = dVar23;
                do {
                  lVar10 = lVar10 + 1;
                  dVar21 = *pdVar16;
                  dVar22 = dVar20;
                  dVar26 = dVar25;
                  if (*(int *)((long)pdVar16 + 0xc) == 0) {
                    dVar22 = dVar21;
                    if (dVar21 <= dVar20) {
                      dVar22 = dVar20;
                    }
                  }
                  else {
                    dVar26 = dVar21;
                    if (dVar25 <= dVar21) {
                      dVar26 = dVar25;
                    }
                  }
                  iVar14 = iVar19;
                  if ((long)local_38 <= lVar10) break;
                  iVar13 = iVar13 + 1;
                  pdVar1 = pdVar16 + 3;
                  pdVar16 = pdVar16 + 2;
                  dVar20 = dVar22;
                  dVar25 = dVar26;
                  iVar14 = iVar13;
                } while (*(uint *)pdVar1 == uVar4);
                iVar13 = iVar18 + 1;
                if (iVar18 + 1 <= (int)local_80) {
                  iVar13 = (int)local_80;
                }
                pHVar12 = pHVar12 + lVar17;
                dVar20 = dVar3;
                do {
                  lVar17 = lVar17 + 1;
                  dVar25 = pHVar12->boundval;
                  dVar21 = dVar20;
                  dVar24 = dVar23;
                  if (pHVar12->boundtype == kLower) {
                    dVar21 = dVar25;
                    if (dVar25 <= dVar20) {
                      dVar21 = dVar20;
                    }
                  }
                  else {
                    dVar24 = dVar25;
                    if (dVar23 <= dVar25) {
                      dVar24 = dVar23;
                    }
                  }
                  iVar19 = iVar13;
                  if ((long)local_40 <= lVar17) break;
                  iVar18 = iVar18 + 1;
                  pHVar8 = pHVar12 + 1;
                  pHVar12 = pHVar12 + 1;
                  dVar20 = dVar21;
                  dVar23 = dVar24;
                  iVar19 = iVar18;
                } while (pHVar8->column == uVar4);
                pvVar11 = local_a0;
                iVar18 = iVar19;
                iVar13 = iVar14;
                if ((this->colsubstituted).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[local_98] == '\0') {
                  dVar23 = *(double *)
                            (*(long *)&(pHVar5->domain).col_lower_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            local_98 * 8);
                  pdVar16 = (double *)
                            (*(long *)&(pHVar5->domain).col_upper_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            local_98 * 8);
                  if ((dVar23 != *pdVar16) || (NAN(dVar23) || NAN(*pdVar16))) {
                    if ((dVar22 != dVar26) ||
                       ((((NAN(dVar22) || NAN(dVar26) || (dVar21 != dVar24)) ||
                         (NAN(dVar21) || NAN(dVar24))) ||
                        (pdVar16 = &((this->mipsolver->mipdata_)._M_t.
                                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                    _M_head_impl)->feastol,
                        ABS(dVar22 - dVar21) < *pdVar16 || ABS(dVar22 - dVar21) == *pdVar16)))) {
                      if (dVar22 <= dVar21) {
                        dVar21 = dVar22;
                      }
                      if (dVar3 < dVar21) {
                        boundchg.column = uVar4;
                        boundchg.boundval = dVar21;
                        boundchg.boundtype = kLower;
                        local_58 = dVar26;
                        local_50 = dVar24;
                        HighsDomain::changeBound(local_78,boundchg,(Reason)0xfffffffe);
                        *numReductions = *numReductions + 1;
                        dVar24 = local_50;
                        dVar26 = local_58;
                      }
                      if (dVar24 <= dVar26) {
                        dVar24 = dVar26;
                      }
                      pvVar11 = local_a0;
                      if (*(double *)
                           (*(long *)&(pHVar5->domain).col_upper_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                           local_98 * 8) <= dVar24) goto LAB_002a75e0;
                      boundchg_00._8_8_ = local_a8 + 0x100000000;
                      boundchg_00.boundval = dVar24;
                      HighsDomain::changeBound(local_78,boundchg_00,(Reason)0xfffffffe);
                    }
                    else {
                      local_70.scale = dVar21 - dVar22;
                      __position._M_current =
                           (this->substitutions).
                           super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      local_70.substcol = uVar4;
                      local_70.staycol = col;
                      local_70.offset = dVar22;
                      if (__position._M_current ==
                          (this->substitutions).
                          super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<HighsSubstitution,std::allocator<HighsSubstitution>>::
                        _M_realloc_insert<HighsSubstitution_const&>(local_48,__position,&local_70);
                      }
                      else {
                        (__position._M_current)->offset = dVar22;
                        (__position._M_current)->substcol = uVar4;
                        (__position._M_current)->staycol = col;
                        (__position._M_current)->scale = local_70.scale;
                        ppHVar2 = &(this->substitutions).
                                   super__Vector_base<HighsSubstitution,_std::allocator<HighsSubstitution>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppHVar2 = *ppHVar2 + 1;
                      }
                      (this->colsubstituted).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[local_98] = '\x01';
                    }
                    *numReductions = *numReductions + 1;
                    pvVar11 = local_a0;
                  }
                }
              }
LAB_002a75e0:
            } while ((iVar18 < (int)local_80) && (iVar13 < (int)local_88));
          }
        }
      }
    }
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool HighsImplications::runProbing(HighsInt col, HighsInt& numReductions) {
  HighsDomain& globaldomain = mipsolver.mipdata_->domain;
  if (globaldomain.isBinary(col) && !implicationsCached(col, 1) &&
      !implicationsCached(col, 0) &&
      mipsolver.mipdata_->cliquetable.getSubstitution(col) == nullptr) {
    bool infeasible;

    infeasible = computeImplications(col, 1);
    if (globaldomain.infeasible()) return true;
    if (infeasible) return true;
    if (mipsolver.mipdata_->cliquetable.getSubstitution(col) != nullptr)
      return true;

    infeasible = computeImplications(col, 0);
    if (globaldomain.infeasible()) return true;
    if (infeasible) return true;
    if (mipsolver.mipdata_->cliquetable.getSubstitution(col) != nullptr)
      return true;

    // analyze implications
    const std::vector<HighsDomainChange>& implicsdown =
        getImplications(col, 0, infeasible);
    const std::vector<HighsDomainChange>& implicsup =
        getImplications(col, 1, infeasible);
    HighsInt nimplicsdown = implicsdown.size();
    HighsInt nimplicsup = implicsup.size();
    HighsInt u = 0;
    HighsInt d = 0;

    while (u < nimplicsup && d < nimplicsdown) {
      if (implicsup[u].column < implicsdown[d].column)
        ++u;
      else if (implicsdown[d].column < implicsup[u].column)
        ++d;
      else {
        assert(implicsup[u].column == implicsdown[d].column);
        HighsInt implcol = implicsup[u].column;
        double lbDown = globaldomain.col_lower_[implcol];
        double ubDown = globaldomain.col_upper_[implcol];
        double lbUp = lbDown;
        double ubUp = ubDown;

        do {
          if (implicsdown[d].boundtype == HighsBoundType::kLower)
            lbDown = std::max(lbDown, implicsdown[d].boundval);
          else
            ubDown = std::min(ubDown, implicsdown[d].boundval);
          ++d;
        } while (d < nimplicsdown && implicsdown[d].column == implcol);

        do {
          if (implicsup[u].boundtype == HighsBoundType::kLower)
            lbUp = std::max(lbUp, implicsup[u].boundval);
          else
            ubUp = std::min(ubUp, implicsup[u].boundval);
          ++u;
        } while (u < nimplicsup && implicsup[u].column == implcol);

        if (colsubstituted[implcol] || globaldomain.isFixed(implcol)) continue;

        if (lbDown == ubDown && lbUp == ubUp &&
            std::abs(lbDown - lbUp) > mipsolver.mipdata_->feastol) {
          HighsSubstitution substitution;
          substitution.substcol = implcol;
          substitution.staycol = col;
          substitution.offset = lbDown;
          substitution.scale = lbUp - lbDown;
          substitutions.push_back(substitution);
          colsubstituted[implcol] = true;
          ++numReductions;
        } else {
          double lb = std::min(lbDown, lbUp);
          double ub = std::max(ubDown, ubUp);

          if (lb > globaldomain.col_lower_[implcol]) {
            globaldomain.changeBound(HighsBoundType::kLower, implcol, lb,
                                     HighsDomain::Reason::unspecified());
            ++numReductions;
          }

          if (ub < globaldomain.col_upper_[implcol]) {
            globaldomain.changeBound(HighsBoundType::kUpper, implcol, ub,
                                     HighsDomain::Reason::unspecified());
            ++numReductions;
          }
        }
      }
    }

    return true;
  }

  return false;
}